

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,char element)

{
  uint *puVar1;
  uint8_t *puVar2;
  
  if (this->minalign_ == 0) {
    this->minalign_ = 1;
  }
  vector_downward<unsigned_int>::ensure_space(&this->buf_,1);
  puVar2 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar2 + -1;
  puVar1 = &(this->buf_).size_;
  *puVar1 = *puVar1 + 1;
  puVar2[-1] = element;
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }